

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::detail::rawMemoryToString(void *object,uint size)

{
  _Setfill<char> _Var1;
  Arch AVar2;
  ostream *poVar3;
  ostream *this;
  int in_EDX;
  long in_RSI;
  String *in_RDI;
  ostringstream oss;
  uchar *bytes;
  int inc;
  int end;
  int i;
  undefined7 in_stack_fffffffffffffe00;
  string local_1d8 [36];
  int local_1b4;
  char local_1ad;
  ostream local_1a0;
  long local_28;
  int local_20;
  int local_1c;
  int local_18;
  long local_10;
  
  local_18 = 0;
  local_20 = 1;
  local_1c = in_EDX;
  local_10 = in_RSI;
  AVar2 = anon_unknown_14::Endianness::which();
  if (AVar2 == Little) {
    local_18 = local_1c + -1;
    local_20 = -1;
    local_1c = -1;
  }
  local_28 = local_10;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  poVar3 = std::operator<<(&local_1a0,"0x");
  _Var1 = std::setfill<char>('0');
  local_1ad = _Var1._M_c;
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  std::ostream::operator<<(poVar3,std::hex);
  for (; local_18 != local_1c; local_18 = local_20 + local_18) {
    local_1b4 = (int)std::setw(2);
    this = std::operator<<(&local_1a0,(_Setw)local_1b4);
    std::ostream::operator<<(this,(uint)*(byte *)(local_28 + local_18));
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::c_str();
  String::String((String *)CONCAT17(_Var1._M_c,in_stack_fffffffffffffe00),(char *)poVar3);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  return in_RDI;
}

Assistant:

String rawMemoryToString(const void* object, unsigned size) {
        // Reverse order for little endian architectures
        int i = 0, end = static_cast<int>(size), inc = 1;
        if(Endianness::which() == Endianness::Little) {
            i   = end - 1;
            end = inc = -1;
        }

        unsigned const char* bytes = static_cast<unsigned const char*>(object);
        std::ostringstream   oss;
        oss << "0x" << std::setfill('0') << std::hex;
        for(; i != end; i += inc)
            oss << std::setw(2) << static_cast<unsigned>(bytes[i]);
        return oss.str().c_str();
    }